

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CMU462::Viewer::drawInfo(void)

{
  OSDText *pOVar1;
  int iVar2;
  string *this;
  undefined8 uVar3;
  undefined8 uVar4;
  Color color;
  string framerate_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  sys_curr = std::chrono::_V2::system_clock::now();
  if ((double)(sys_curr - sys_last) / 1000000000.0 < 1.0) {
    framecount = framecount + 1;
    goto LAB_001b3449;
  }
  if (framecount < 0x14) {
    uVar4 = 0x3f8000003eb33333;
    if (0x13 < framecount) goto LAB_001b3381;
LAB_001b336d:
    uVar3 = 0x3eb333333f800000;
  }
  else {
    uVar4 = 0x3f8000003e19999a;
    if (framecount < 0x14) goto LAB_001b336d;
LAB_001b3381:
    uVar3 = 0x3f0000003e19999a;
  }
  color.b = (float)(int)uVar4;
  color.a = (float)(int)((ulong)uVar4 >> 0x20);
  color.r = (float)(int)uVar3;
  color.g = (float)(int)((ulong)uVar3 >> 0x20);
  OSDText::set_color(osd_text,line_id_framerate,color);
  std::__cxx11::to_string(&local_38,framecount);
  std::operator+(&local_b8,"Framerate: ",&local_38);
  std::operator+(&bStack_d8,&local_b8," fps");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  iVar2 = line_id_framerate;
  pOVar1 = osd_text;
  std::__cxx11::string::string((string *)&local_58,(string *)&bStack_d8);
  OSDText::set_text(pOVar1,iVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  framecount = 0;
  sys_last = sys_curr;
  std::__cxx11::string::~string((string *)&bStack_d8);
LAB_001b3449:
  if (renderer == (long *)0x0) {
    std::__cxx11::string::string((string *)&bStack_d8,"No input renderer",(allocator *)&local_b8);
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    std::__cxx11::string::string((string *)&local_98,(string *)&bStack_d8);
    OSDText::set_text(pOVar1,iVar2,&local_98);
    this = &local_98;
  }
  else {
    (**(code **)(*renderer + 0x30))(&bStack_d8);
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    std::__cxx11::string::string((string *)&local_78,(string *)&bStack_d8);
    OSDText::set_text(pOVar1,iVar2,&local_78);
    this = &local_78;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&bStack_d8);
  OSDText::render(osd_text);
  return;
}

Assistant:

void Viewer::drawInfo() {

  // compute timers - fps is update every second
  sys_curr = system_clock::now();
  double elapsed = ((duration<double>) (sys_curr - sys_last)).count();
  if (elapsed >= 1.0f) {

    // update framecount OSD
    Color c = framecount < 20 ? Color(1.0, 0.35, 0.35) : Color(0.15, 0.5, 0.15);
    osd_text->set_color(line_id_framerate, c);
    string framerate_info = "Framerate: " + to_string(framecount) + " fps";
    osd_text->set_text(line_id_framerate, framerate_info);

    // reset timer and counter
    framecount = 0;
    sys_last = sys_curr; 

  } else {

    // increment framecount
    framecount++;
  
  }

  // udpate renderer OSD
  // TODO: This is done on every update and it shouldn't be!
  // The viewer should only update when the renderer needs to
  // update the info text. 
  if (renderer) {
    string renderer_info = renderer->info();
    osd_text->set_text(line_id_renderer, renderer_info);
  } else {
    string renderer_info = "No input renderer";
    osd_text->set_text(line_id_renderer, renderer_info);
  }

  // render OSD
  osd_text->render();

}